

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  vector<wabt::Error,std::allocator<wabt::Error>> *this_00;
  undefined8 uVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  TokenType TVar5;
  tuple<wabt::Module_*,_std::default_delete<wabt::Module>_> module_00;
  Enum EVar6;
  long *plVar7;
  TokenTypePair pair;
  long lVar8;
  pointer __p;
  __single_object module;
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> local_a8;
  ErrorLevel local_9c;
  undefined1 local_98 [32];
  long *local_78 [2];
  long local_68 [2];
  Location local_58;
  
  module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)operator_new(0x3c0);
  memset((void *)module_00.
                 super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                 super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,0,0x3a0);
  (((string *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x20))->_M_dataplus)._M_p =
       (pointer)((long)module_00.
                       super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x30);
  ((ModuleFieldList *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x40))->first_ =
       (ModuleField *)0x0;
  *(ModuleField **)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x48) = (ModuleField *)0x0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x5c) = 0;
  *(undefined8 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 100) = 0;
  memset((vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *)
         ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x70),0,0x120);
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 400))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1c0);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x198) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1a0))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1a8) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1b0))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1b8) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1c0) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1c8))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1f8);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1d0) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1d8))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1e0) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1e8))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1f0) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1f8) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x200))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x230);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x208) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x210))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x218) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x220))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x228) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x230) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x238))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x268);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x240) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x248))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x250) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 600))->_M_max_load_factor = 1.0
  ;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x260) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x268) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x270))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2a0);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x278) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x280))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x288) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x290))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x298) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2a0) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2a8))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2d8);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2b0) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2b8))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2c0) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2c8))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2d0) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2d8) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2e0))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x310);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2e8) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2f0))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2f8) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x300))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x308) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x310) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x318))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x348);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 800) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x328))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x330) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x338))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x340) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x348) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x350))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x380);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x358) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x360))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x368) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x370))->_M_max_load_factor =
       1.0;
  *(_Base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x3a0) = (_Base_ptr)0x0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x378) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x380) = (__node_base_ptr)0x0;
  *(undefined4 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x387) = 0;
  *(_Base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x3a8) =
       (_Base_ptr)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x398);
  *(_Base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x3b0) =
       (_Base_ptr)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x398);
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x3b8) = 0;
  local_a8._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
  bVar2 = PeekMatchLpar(this,Module);
  if (bVar2) {
    local_98._0_8_ = (__uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>)0x0;
    RVar3 = ParseModuleCommand(this,(Script *)0x0,(CommandPtr *)local_98);
    uVar1 = local_98._0_8_;
    if (RVar3.enum_ == Error) {
      if ((Command *)local_98._0_8_ != (Command *)0x0) {
        (*(*(_func_int ***)local_98._0_8_)[1])(local_98._0_8_);
      }
      EVar6 = Error;
      goto LAB_0013765b;
    }
    if ((*(CommandType *)(local_98._0_8_ + 8) != ScriptModule) &&
       (*(CommandType *)(local_98._0_8_ + 8) != First)) {
      __assert_fail("isa<ScriptModuleCommand>(command.get())",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0x4a2,"Result wabt::WastParser::ParseModule(std::unique_ptr<Module> *)");
    }
    Module::operator=((Module *)
                      module_00.
                      super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
                      (Module *)(local_98._0_8_ + 0x10));
    (*(*(_func_int ***)uVar1)[1])(uVar1);
  }
  else {
    TVar4 = Peek(this,0);
    TVar5 = Peek(this,1);
    pair._M_elems[1] = TVar5;
    pair._M_elems[0] = TVar4;
    bVar2 = anon_unknown_1::IsModuleField(pair);
    if ((bVar2) || (bVar2 = PeekIsCustom(this), bVar2)) {
      RVar3 = ParseModuleFieldList
                        (this,(Module *)
                              module_00.
                              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                              .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
      EVar6 = Error;
      if (RVar3.enum_ == Error) goto LAB_0013765b;
    }
    else {
      TVar4 = Peek(this,0);
      if (TVar4 == Eof) {
        this_00 = (vector<wabt::Error,std::allocator<wabt::Error>> *)this->errors_;
        local_9c = Warning;
        GetToken((Token *)local_98,this);
        local_58.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_98._16_8_
        ;
        local_58.field_1._8_8_ = local_98._24_8_;
        local_58.filename._M_len = local_98._0_8_;
        local_58.filename._M_str = (char *)local_98._8_8_;
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location,char_const(&)[13]>
                  (this_00,&local_9c,&local_58,(char (*) [13])"empty module");
      }
      else {
        Match(this,Lpar);
        local_98._0_8_ = (long)local_98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"a module field","");
        plVar7 = local_68;
        local_78[0] = plVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"a module","");
        local_58.filename._M_len = 0;
        local_58.filename._M_str = (char *)0x0;
        local_58.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   (string *)local_98,&local_58);
        ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_58,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        lVar8 = -0x40;
        do {
          if (plVar7 != (long *)plVar7[-2]) {
            operator_delete((long *)plVar7[-2],*plVar7 + 1);
          }
          plVar7 = plVar7 + -4;
          lVar8 = lVar8 + 0x20;
        } while (lVar8 != 0);
      }
    }
  }
  RVar3 = Expect(this,Eof);
  EVar6 = Error;
  if ((RVar3.enum_ != Error) && (bVar2 = HasError(this), !bVar2)) {
    local_a8._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
    super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
         (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
         (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)0x0;
    std::__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>::reset
              ((__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> *)out_module,
               (pointer)module_00.
                        super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    EVar6 = Ok;
  }
LAB_0013765b:
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&local_a8);
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = std::make_unique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    if (isa<ModuleCommand>(command.get())) {
      auto module_command = cast<ModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    } else {
      assert(isa<ScriptModuleCommand>(command.get()));
      auto module_command = cast<ScriptModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    }
  } else if (IsModuleField(PeekPair()) || PeekIsCustom()) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else if (PeekMatch(TokenType::Eof)) {
    errors_->emplace_back(ErrorLevel::Warning, GetLocation(), "empty module");
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (!HasError()) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}